

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.cc
# Opt level: O1

bool __thiscall google::protobuf::safe_strtob(protobuf *this,StringPiece str,bool *value)

{
  protobuf pVar1;
  byte bVar2;
  protobuf pVar3;
  uint uVar4;
  bool bVar5;
  undefined1 uVar6;
  LogMessage *pLVar7;
  char *pcVar8;
  int iVar9;
  long lVar10;
  StringPiece s1;
  StringPiece s1_00;
  StringPiece s1_01;
  StringPiece s1_02;
  LogFinisher local_a1;
  StringPiece local_a0;
  StringPiece local_90;
  StringPiece local_80;
  StringPiece local_70;
  LogMessage local_60;
  
  s1.length_ = str.ptr_;
  if ((undefined1 *)str.length_ == (undefined1 *)0x0) {
    internal::LogMessage::LogMessage
              (&local_60,LOGLEVEL_DFATAL,"third_party/protobuf-lite/strutil.cc",0x519);
    pLVar7 = internal::LogMessage::operator<<(&local_60,"CHECK failed: value != nullptr: ");
    pLVar7 = internal::LogMessage::operator<<(pLVar7,"nullptr output boolean given.");
    internal::LogFinisher::operator=(&local_a1,pLVar7);
    internal::LogMessage::~LogMessage(&local_60);
  }
  switch(s1.length_) {
  case (char *)0x1:
switchD_001a7f51_caseD_1:
    pcVar8 = (char *)0x0;
    do {
      pVar1 = this[(long)pcVar8];
      pVar3 = (protobuf)((char)pVar1 + 0x20);
      if (0x19 < (byte)((char)pVar1 + 0xbfU)) {
        pVar3 = pVar1;
      }
      bVar2 = pcVar8[0x1e5b4e];
      uVar4 = bVar2 + 0x20 & 0xff;
      if (0x19 < (byte)(bVar2 + 0xbf)) {
        uVar4 = (uint)bVar2;
      }
      iVar9 = (byte)pVar3 - uVar4;
      if (pVar3 != SUB41(uVar4,0)) goto LAB_001a7fb5;
      pcVar8 = pcVar8 + 1;
    } while (s1.length_ != pcVar8);
    iVar9 = 0;
LAB_001a7fb5:
    if (iVar9 == 0) goto LAB_001a82c7;
    if (s1.length_ == (char *)0x1) {
LAB_001a80e7:
      pcVar8 = (char *)0x0;
      do {
        pVar1 = this[(long)pcVar8];
        pVar3 = (protobuf)((char)pVar1 + 0x20);
        if (0x19 < (byte)((char)pVar1 + 0xbfU)) {
          pVar3 = pVar1;
        }
        bVar2 = pcVar8[0x1e5f51];
        uVar4 = bVar2 + 0x20 & 0xff;
        if (0x19 < (byte)(bVar2 + 0xbf)) {
          uVar4 = (uint)bVar2;
        }
        iVar9 = (byte)pVar3 - uVar4;
        if (pVar3 != SUB41(uVar4,0)) goto LAB_001a8149;
        pcVar8 = pcVar8 + 1;
      } while (s1.length_ != pcVar8);
      iVar9 = 0;
LAB_001a8149:
      uVar6 = 1;
      if (iVar9 == 0) goto LAB_001a82c9;
      if (s1.length_ == (char *)0x5) goto switchD_001a7f51_caseD_5;
      if (s1.length_ == (char *)0x1) {
        lVar10 = 0;
        do {
          pVar1 = this[lVar10];
          pVar3 = (protobuf)((char)pVar1 + 0x20);
          if (0x19 < (byte)((char)pVar1 + 0xbfU)) {
            pVar3 = pVar1;
          }
          bVar2 = "0.2.1"[lVar10 + 4];
          uVar4 = bVar2 + 0x20 & 0xff;
          if (0x19 < (byte)(bVar2 + 0xbf)) {
            uVar4 = (uint)bVar2;
          }
          iVar9 = (byte)pVar3 - uVar4;
          if (pVar3 != SUB41(uVar4,0)) goto LAB_001a81c7;
          lVar10 = lVar10 + 1;
        } while (lVar10 != 1);
        iVar9 = 0;
LAB_001a81c7:
        if (iVar9 == 0) goto LAB_001a82c9;
      }
    }
    else {
      if (s1.length_ == (char *)0x5) goto switchD_001a7f51_caseD_5;
      if (s1.length_ == (char *)0x3) goto switchD_001a7f51_caseD_3;
    }
    break;
  case (char *)0x3:
switchD_001a7f51_caseD_3:
    pcVar8 = (char *)0x0;
    do {
      pVar1 = this[(long)pcVar8];
      pVar3 = (protobuf)((char)pVar1 + 0x20);
      if (0x19 < (byte)((char)pVar1 + 0xbfU)) {
        pVar3 = pVar1;
      }
      bVar2 = pcVar8[0x1e35b1];
      uVar4 = bVar2 + 0x20 & 0xff;
      if (0x19 < (byte)(bVar2 + 0xbf)) {
        uVar4 = (uint)bVar2;
      }
      iVar9 = (byte)pVar3 - uVar4;
      if (pVar3 != SUB41(uVar4,0)) goto LAB_001a80cb;
      pcVar8 = pcVar8 + 1;
    } while (s1.length_ != pcVar8);
    iVar9 = 0;
LAB_001a80cb:
    if (iVar9 == 0) {
LAB_001a82c7:
      uVar6 = 1;
      goto LAB_001a82c9;
    }
    if (s1.length_ == (char *)0x5) goto switchD_001a7f51_caseD_5;
    if (s1.length_ == (char *)0x1) goto LAB_001a80e7;
    break;
  case (char *)0x4:
    pcVar8 = (char *)0x0;
    do {
      pVar1 = this[(long)pcVar8];
      pVar3 = (protobuf)((char)pVar1 + 0x20);
      if (0x19 < (byte)((char)pVar1 + 0xbfU)) {
        pVar3 = pVar1;
      }
      bVar2 = pcVar8[0x1e35ac];
      uVar4 = bVar2 + 0x20 & 0xff;
      if (0x19 < (byte)(bVar2 + 0xbf)) {
        uVar4 = (uint)bVar2;
      }
      iVar9 = (byte)pVar3 - uVar4;
      if (pVar3 != SUB41(uVar4,0)) goto LAB_001a8042;
      pcVar8 = pcVar8 + 1;
    } while (s1.length_ != pcVar8);
    iVar9 = 0;
LAB_001a8042:
    if (iVar9 == 0) goto LAB_001a82c7;
    if (s1.length_ == (char *)0x5) goto switchD_001a7f51_caseD_5;
    if (s1.length_ == (char *)0x3) goto switchD_001a7f51_caseD_3;
    if (s1.length_ == (char *)0x1) goto switchD_001a7f51_caseD_1;
    break;
  case (char *)0x5:
switchD_001a7f51_caseD_5:
    pcVar8 = (char *)0x0;
    do {
      pVar1 = this[(long)pcVar8];
      pVar3 = (protobuf)((char)pVar1 + 0x20);
      if (0x19 < (byte)((char)pVar1 + 0xbfU)) {
        pVar3 = pVar1;
      }
      bVar2 = pcVar8[0x1e6914];
      uVar4 = bVar2 + 0x20 & 0xff;
      if (0x19 < (byte)(bVar2 + 0xbf)) {
        uVar4 = (uint)bVar2;
      }
      iVar9 = (byte)pVar3 - uVar4;
      if (pVar3 != SUB41(uVar4,0)) goto LAB_001a8237;
      pcVar8 = pcVar8 + 1;
    } while (s1.length_ != pcVar8);
    iVar9 = 0;
LAB_001a8237:
    if (iVar9 != 0) break;
    goto LAB_001a82c3;
  }
  StringPiece::StringPiece(&local_70,"f");
  s1.ptr_ = (char *)this;
  bVar5 = CaseEqual(s1,local_70);
  if (!bVar5) {
    StringPiece::StringPiece(&local_80,"no");
    s1_00.length_ = (stringpiece_ssize_type)s1.length_;
    s1_00.ptr_ = (char *)this;
    bVar5 = CaseEqual(s1_00,local_80);
    if (!bVar5) {
      StringPiece::StringPiece(&local_90,"n");
      s1_01.length_ = (stringpiece_ssize_type)s1.length_;
      s1_01.ptr_ = (char *)this;
      bVar5 = CaseEqual(s1_01,local_90);
      if (!bVar5) {
        StringPiece::StringPiece(&local_a0,"0");
        s1_02.length_ = (stringpiece_ssize_type)s1.length_;
        s1_02.ptr_ = (char *)this;
        bVar5 = CaseEqual(s1_02,local_a0);
        uVar6 = 0;
        if (!bVar5) {
          return false;
        }
        goto LAB_001a82c9;
      }
    }
  }
LAB_001a82c3:
  uVar6 = 0;
LAB_001a82c9:
  *(undefined1 *)str.length_ = uVar6;
  return true;
}

Assistant:

bool safe_strtob(StringPiece str, bool* value) {
  GOOGLE_CHECK(value != nullptr) << "nullptr output boolean given.";
  if (CaseEqual(str, "true") || CaseEqual(str, "t") ||
      CaseEqual(str, "yes") || CaseEqual(str, "y") ||
      CaseEqual(str, "1")) {
    *value = true;
    return true;
  }
  if (CaseEqual(str, "false") || CaseEqual(str, "f") ||
      CaseEqual(str, "no") || CaseEqual(str, "n") ||
      CaseEqual(str, "0")) {
    *value = false;
    return true;
  }
  return false;
}